

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  bool bVar1;
  undefined8 *in_RSI;
  Mat *in_RDI;
  Mat *in_stack_ffffffffffffff60;
  Mat *m;
  Mat local_88;
  undefined1 local_48 [48];
  undefined8 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)*in_RSI)(local_48,in_RSI,in_RDI[3].dims,0);
  Mat::operator=(in_RDI,in_stack_ffffffffffffff60);
  Mat::~Mat((Mat *)0x1550d8);
  bVar1 = Mat::empty(in_stack_ffffffffffffff60);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (*(int *)((long)&in_RDI[3].elemsize + 4) != 0) {
      m = &local_88;
      (**(code **)*local_18)(m,local_18,in_RDI[2].h,1);
      Mat::operator=(in_RDI,m);
      Mat::~Mat((Mat *)0x15517a);
      bVar1 = Mat::empty(m);
      if (bVar1) {
        return -100;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}